

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglconvenience.cpp
# Opt level: O0

QSurfaceFormat
q_glFormatFromConfig(EGLDisplay display,EGLConfig config,QSurfaceFormat *referenceFormat)

{
  RenderableType RVar1;
  OpenGLModuleType OVar2;
  char *pcVar3;
  QSurfaceFormat *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  QSurfaceFormatPrivate *in_RDI;
  long in_FS_OFFSET;
  QSurfaceFormat *format;
  EGLint renderableType;
  EGLint sampleCount;
  EGLint stencilSize;
  EGLint depthSize;
  EGLint alphaSize;
  EGLint blueSize;
  EGLint greenSize;
  EGLint redSize;
  RenderableType in_stack_ffffffffffffff9c;
  QSurfaceFormatPrivate *this;
  uint local_28 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QSurfaceFormat::QSurfaceFormat((QSurfaceFormat *)in_RDI);
  local_28[7] = 0;
  local_28[6] = 0;
  local_28[5] = 0;
  local_28[4] = 0;
  local_28[3] = 0;
  local_28[2] = 0;
  local_28[1] = 0;
  local_28[0] = 0;
  eglGetConfigAttrib(in_RSI,in_RDX,0x3024,local_28 + 7);
  eglGetConfigAttrib(in_RSI,in_RDX,0x3023,local_28 + 6);
  eglGetConfigAttrib(in_RSI,in_RDX,0x3022,local_28 + 5);
  eglGetConfigAttrib(in_RSI,in_RDX,0x3021,local_28 + 4);
  eglGetConfigAttrib(in_RSI,in_RDX,0x3025,local_28 + 3);
  eglGetConfigAttrib(in_RSI,in_RDX,0x3026,local_28 + 2);
  eglGetConfigAttrib(in_RSI,in_RDX,0x3031,local_28 + 1);
  eglGetConfigAttrib(in_RSI,in_RDX,0x3040,local_28);
  RVar1 = QSurfaceFormat::renderableType(in_RCX);
  if ((RVar1 == OpenVG) && ((local_28[0] & 2) != 0)) {
    QSurfaceFormat::setRenderableType((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  }
  else {
    RVar1 = QSurfaceFormat::renderableType(in_RCX);
    if ((RVar1 == OpenGL) && ((local_28[0] & 8) != 0)) {
      QSurfaceFormat::setRenderableType((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
    }
    else {
      RVar1 = QSurfaceFormat::renderableType(in_RCX);
      if ((RVar1 == DefaultRenderableType) &&
         (OVar2 = QOpenGLContext::openGLModuleType(), OVar2 == LibGL)) {
        pcVar3 = (char *)eglQueryString(in_RSI,0x3053);
        pcVar3 = strstr(pcVar3,"NVIDIA");
        if ((pcVar3 == (char *)0x0) && ((local_28[0] & 8) != 0)) {
          QSurfaceFormat::setRenderableType((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
          goto LAB_009543db;
        }
      }
      QSurfaceFormat::setRenderableType((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
    }
  }
LAB_009543db:
  QSurfaceFormat::setRedBufferSize((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  QSurfaceFormat::setGreenBufferSize((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  QSurfaceFormat::setBlueBufferSize((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  QSurfaceFormat::setAlphaBufferSize((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  QSurfaceFormat::setDepthBufferSize((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  QSurfaceFormat::setStencilBufferSize((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  QSurfaceFormat::setSamples((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  QSurfaceFormat::setStereo((QSurfaceFormat *)this,SUB41(in_stack_ffffffffffffff9c >> 0x18,0));
  QSurfaceFormat::swapInterval(in_RCX);
  QSurfaceFormat::setSwapInterval((QSurfaceFormat *)this,in_stack_ffffffffffffff9c);
  eglGetError();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QSurfaceFormat)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QSurfaceFormat q_glFormatFromConfig(EGLDisplay display, const EGLConfig config, const QSurfaceFormat &referenceFormat)
{
    QSurfaceFormat format;
    EGLint redSize     = 0;
    EGLint greenSize   = 0;
    EGLint blueSize    = 0;
    EGLint alphaSize   = 0;
    EGLint depthSize   = 0;
    EGLint stencilSize = 0;
    EGLint sampleCount = 0;
    EGLint renderableType = 0;

    eglGetConfigAttrib(display, config, EGL_RED_SIZE,     &redSize);
    eglGetConfigAttrib(display, config, EGL_GREEN_SIZE,   &greenSize);
    eglGetConfigAttrib(display, config, EGL_BLUE_SIZE,    &blueSize);
    eglGetConfigAttrib(display, config, EGL_ALPHA_SIZE,   &alphaSize);
    eglGetConfigAttrib(display, config, EGL_DEPTH_SIZE,   &depthSize);
    eglGetConfigAttrib(display, config, EGL_STENCIL_SIZE, &stencilSize);
    eglGetConfigAttrib(display, config, EGL_SAMPLES,      &sampleCount);
    eglGetConfigAttrib(display, config, EGL_RENDERABLE_TYPE, &renderableType);

    if (referenceFormat.renderableType() == QSurfaceFormat::OpenVG && (renderableType & EGL_OPENVG_BIT))
        format.setRenderableType(QSurfaceFormat::OpenVG);
#ifdef EGL_VERSION_1_4
    else if (referenceFormat.renderableType() == QSurfaceFormat::OpenGL
             && (renderableType & EGL_OPENGL_BIT))
        format.setRenderableType(QSurfaceFormat::OpenGL);
    else if (referenceFormat.renderableType() == QSurfaceFormat::DefaultRenderableType
#ifndef QT_NO_OPENGL
             && QOpenGLContext::openGLModuleType() == QOpenGLContext::LibGL
             && !strstr(eglQueryString(display, EGL_VENDOR), "NVIDIA")
#endif
             && (renderableType & EGL_OPENGL_BIT))
        format.setRenderableType(QSurfaceFormat::OpenGL);
#endif
    else
        format.setRenderableType(QSurfaceFormat::OpenGLES);

    format.setRedBufferSize(redSize);
    format.setGreenBufferSize(greenSize);
    format.setBlueBufferSize(blueSize);
    format.setAlphaBufferSize(alphaSize);
    format.setDepthBufferSize(depthSize);
    format.setStencilBufferSize(stencilSize);
    format.setSamples(sampleCount);
    format.setStereo(false);         // EGL doesn't support stereo buffers
    format.setSwapInterval(referenceFormat.swapInterval());

    // Clear the EGL error state because some of the above may
    // have errored out because the attribute is not applicable
    // to the surface type.  Such errors don't matter.
    eglGetError();

    return format;
}